

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::fill<fmt::v9::appender,char>(appender it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  appender aVar2;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    aVar2 = fill_n<fmt::v9::appender,unsigned_long,char>(it,n,fill->data_);
    return (appender)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (n != 0) {
    do {
      buffer<char>::append<char>
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,fill->data_
                 ,fill->data_ + bVar1);
      n = n - 1;
    } while (n != 0);
  }
  return (appender)it.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container
  ;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}